

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

string * miniros::names::parentNamespace(string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  InvalidNameException *this;
  string stripped_name;
  string error;
  string local_30 [32];
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar1 = validate(name,&error);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&stripped_name);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"/",(allocator<char> *)&stripped_name);
      }
      else {
        stripped_name._M_dataplus._M_p = (pointer)&stripped_name.field_2;
        stripped_name._M_string_length = 0;
        stripped_name.field_2._M_local_buf[0] = '\0';
        lVar3 = std::__cxx11::string::rfind((char)name,0x2f);
        if (lVar3 == name->_M_string_length - 1) {
          std::__cxx11::string::substr((ulong)local_30,(ulong)name);
          std::__cxx11::string::operator=((string *)&stripped_name,local_30);
          std::__cxx11::string::~string(local_30);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&stripped_name);
        }
        lVar3 = std::__cxx11::string::rfind((char)&stripped_name,0x2f);
        if (lVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"/",(allocator<char> *)local_30);
        }
        else if (lVar3 == -1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",(allocator<char> *)local_30);
        }
        else {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&stripped_name);
        }
        std::__cxx11::string::~string((string *)&stripped_name);
      }
    }
    std::__cxx11::string::~string((string *)&error);
    return __return_storage_ptr__;
  }
  this = (InvalidNameException *)__cxa_allocate_exception(0x10);
  InvalidNameException::InvalidNameException(this,&error);
  __cxa_throw(this,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string parentNamespace(const std::string& name)
{
  std::string error;
  if (!validate(name, error))
  {
  	throw InvalidNameException(error);
  }

  if (!name.compare(""))  return "";
  if (!name.compare("/")) return "/"; 

  std::string stripped_name;

  // rstrip trailing slash
  if (name.find_last_of('/') == name.size()-1)
    stripped_name = name.substr(0, name.size() -2);
  else
    stripped_name = name;

  //pull everything up to the last /
  size_t last_pos = stripped_name.find_last_of('/');
  if (last_pos == std::string::npos)
  {
    return "";
  }
  else if (last_pos == 0)
    return "/";
  return stripped_name.substr(0, last_pos);
}